

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::FuncEscapes(ByteCodeGenerator *this,Scope *scope)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (scope != (Scope *)0x0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (scope->func == (FuncInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x11fb,"(scope->GetFunc())","scope->GetFunc()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      puVar1 = &scope->func->field_0xb4;
      *(uint *)puVar1 = *(uint *)puVar1 | 0x800;
      scope = scope->enclosingScope;
    } while (scope != (Scope *)0x0);
  }
  if ((this->flags & 0x400) != 0) {
    this->funcEscapes = true;
  }
  return;
}

Assistant:

void ByteCodeGenerator::FuncEscapes(Scope *scope)
{
    while (scope)
    {
        Assert(scope->GetFunc());
        scope->GetFunc()->SetEscapes(true);
        scope = scope->GetEnclosingScope();
    }

    if (this->flags & fscrEval)
    {
        // If a function declared inside eval escapes, we'll need
        // to invalidate the caller's cached scope.
        this->funcEscapes = true;
    }
}